

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::IsEndOfAlternative
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  EncodedChar EVar1;
  bool bVar2;
  bool local_21;
  EncodedChar ec;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_local;
  
  EVar1 = ECLookahead(this,0);
  if ((EVar1 == '\0') && (bVar2 = IsEOF(this), bVar2)) {
    return true;
  }
  local_21 = true;
  if ((EVar1 != ')') && (local_21 = true, EVar1 != '|')) {
    local_21 = EVar1 == '/';
  }
  return local_21;
}

Assistant:

inline bool Parser<P, IsLiteral>::IsEndOfAlternative()
    {
        EncodedChar ec = ECLookahead();
        // Could be terminating 0, but embedded 0 is part of alternative
        return (ec == 0 && IsEOF()) || ec == ')' || ec == '|' || (IsLiteral && ec == '/');
    }